

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetObservationProbability
          (MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  Index in_stack_00000098;
  Index in_stack_0000009c;
  Index in_stack_000000a0;
  Index in_stack_000000a4;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_000000a8;
  
  GetObservationProbability
            (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_0000009c,
             in_stack_00000098);
  return;
}

Assistant:

double MultiAgentDecisionProcessDiscreteFactoredStates::
GetObservationProbability  (Index sI, Index jaI, Index sucSI, Index joI) const
{
    if(_m_cached_FlatOM)
        return _m_p_oModel->Get(sI, jaI, sucSI, joI);
    vector<Index> X = StateIndexToFactorValueIndices(sI);
    vector<Index> O = JointToIndividualObservationIndices(joI);
    vector<Index> Y = StateIndexToFactorValueIndices(sucSI);
    vector<Index> A = JointToIndividualActionIndices(jaI);
    return(_m_2dbn.GetOProbability(X,A,Y,O));
}